

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O2

void __thiscall cubeb_log_message::cubeb_log_message(cubeb_log_message *this,char *str)

{
  size_t __n;
  
  __n = strlen(str);
  if (__n < 0x100) {
    memcpy(this,str,__n);
    this->storage[__n] = '\0';
  }
  return;
}

Assistant:

cubeb_log_message(char const str[CUBEB_LOG_MESSAGE_MAX_SIZE])
  {
    size_t length = strlen(str);
    /* paranoia against malformed message */
    assert(length < CUBEB_LOG_MESSAGE_MAX_SIZE);
    if (length > CUBEB_LOG_MESSAGE_MAX_SIZE - 1) {
      return;
    }
    PodCopy(storage, str, length);
    storage[length] = '\0';
  }